

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMULSM9DS0.cpp
# Opt level: O0

bool __thiscall RTIMULSM9DS0::setAccelCTRL2(RTIMULSM9DS0 *this)

{
  uchar ctrl2;
  RTIMULSM9DS0 *this_local;
  
  if ((((this->super_RTIMU).m_settings)->m_LSM9DS0AccelLpf < 0) ||
     (3 < ((this->super_RTIMU).m_settings)->m_LSM9DS0AccelLpf)) {
    fprintf(_stderr,"Illegal LSM9DS0 accel low pass fiter code %d\n",
            (ulong)(uint)((this->super_RTIMU).m_settings)->m_LSM9DS0AccelLpf);
    this_local._7_1_ = false;
  }
  else {
    switch(((this->super_RTIMU).m_settings)->m_LSM9DS0AccelFsr) {
    case 0:
      this->m_accelScale = 6.1e-05;
      break;
    case 1:
      this->m_accelScale = 0.000122;
      break;
    case 2:
      this->m_accelScale = 0.000183;
      break;
    case 3:
      this->m_accelScale = 0.000244;
      break;
    case 4:
      this->m_accelScale = 0.000732;
      break;
    default:
      fprintf(_stderr,"Illegal LSM9DS0 accel FSR code %d\n",
              (ulong)(uint)((this->super_RTIMU).m_settings)->m_LSM9DS0AccelFsr);
      return false;
    }
    this_local._7_1_ =
         RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                            this->m_accelCompassSlaveAddr,'!',
                            (byte)(((this->super_RTIMU).m_settings)->m_LSM9DS0AccelLpf << 6) |
                            (byte)(((this->super_RTIMU).m_settings)->m_LSM9DS0AccelFsr << 3),
                            "Failed to set LSM9DS0 accel CTRL2");
  }
  return this_local._7_1_;
}

Assistant:

bool RTIMULSM9DS0::setAccelCTRL2()
{
    unsigned char ctrl2;

    if ((m_settings->m_LSM9DS0AccelLpf < 0) || (m_settings->m_LSM9DS0AccelLpf > 3)) {
        HAL_ERROR1("Illegal LSM9DS0 accel low pass fiter code %d\n", m_settings->m_LSM9DS0AccelLpf);
        return false;
    }

    switch (m_settings->m_LSM9DS0AccelFsr) {
    case LSM9DS0_ACCEL_FSR_2:
        m_accelScale = (RTFLOAT)0.000061;
        break;

    case LSM9DS0_ACCEL_FSR_4:
        m_accelScale = (RTFLOAT)0.000122;
        break;

    case LSM9DS0_ACCEL_FSR_6:
        m_accelScale = (RTFLOAT)0.000183;
        break;

    case LSM9DS0_ACCEL_FSR_8:
        m_accelScale = (RTFLOAT)0.000244;
        break;

    case LSM9DS0_ACCEL_FSR_16:
        m_accelScale = (RTFLOAT)0.000732;
        break;

    default:
        HAL_ERROR1("Illegal LSM9DS0 accel FSR code %d\n", m_settings->m_LSM9DS0AccelFsr);
        return false;
    }

    ctrl2 = (m_settings->m_LSM9DS0AccelLpf << 6) | (m_settings->m_LSM9DS0AccelFsr << 3);

    return m_settings->HALWrite(m_accelCompassSlaveAddr,  LSM9DS0_CTRL2, ctrl2, "Failed to set LSM9DS0 accel CTRL2");
}